

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void fixToolBarOrientation(QLayoutItem *item,int dockPos)

{
  undefined4 uVar1;
  QWidgetData *pQVar2;
  undefined4 uVar3;
  int iVar4;
  Orientation OVar5;
  LayoutDirection LVar6;
  undefined4 extraout_var;
  QWidget *this;
  QSize QVar7;
  QSize QVar8;
  QSize QVar9;
  Representation RVar10;
  Orientation orientation;
  Representation RVar11;
  int iVar12;
  long in_FS_OFFSET;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = (*item->_vptr_QLayoutItem[0xd])();
  this = &QtPrivate::qobject_cast_helper<QToolBar*,QObject>((QObject *)CONCAT44(extraout_var,iVar4))
          ->super_QWidget;
  if (this != (QWidget *)0x0) {
    pQVar2 = this->data;
    uVar1 = (pQVar2->crect).x1;
    uVar3 = (pQVar2->crect).y1;
    iVar4 = (pQVar2->crect).x2.m_i;
    orientation = ((dockPos & 0xfffffffeU) != 2) + Horizontal;
    OVar5 = QToolBar::orientation((QToolBar *)this);
    if (orientation != OVar5) {
      QToolBar::setOrientation((QToolBar *)this,orientation);
    }
    QVar7 = (QSize)(**(code **)(*(long *)this + 0x70))(this);
    QVar8 = QWidget::maximumSize(this);
    QVar9 = QVar8;
    if (QVar7.wd.m_i.m_i < QVar8.wd.m_i.m_i) {
      QVar9 = QVar7;
    }
    RVar10.m_i = QVar8.ht.m_i.m_i;
    if (QVar7.ht.m_i.m_i < QVar8.ht.m_i.m_i) {
      RVar10.m_i = QVar7.ht.m_i.m_i;
    }
    QVar7 = QWidget::minimumSize(this);
    RVar11.m_i = QVar9.wd.m_i.m_i;
    if (QVar9.wd.m_i.m_i <= QVar7.wd.m_i.m_i) {
      RVar11.m_i = QVar7.wd.m_i.m_i;
    }
    if (RVar10.m_i <= QVar7.ht.m_i.m_i) {
      RVar10.m_i = QVar7.ht.m_i.m_i;
    }
    QVar9 = QWidget::size(this);
    if ((RVar11.m_i != QVar9.wd.m_i.m_i) || (RVar10.m_i != QVar9.ht.m_i.m_i)) {
      iVar12 = RVar11.m_i + uVar1 + -1;
      local_48.y2.m_i = uVar3 + RVar10.m_i + -1;
      local_48.x1.m_i = uVar1;
      local_48.y1.m_i = uVar3;
      local_48.x2.m_i = iVar12;
      LVar6 = QWidget::layoutDirection(this);
      if (LVar6 == RightToLeft) {
        local_48.x1.m_i = (iVar4 - iVar12) + uVar1;
        local_48.x2.m_i = iVar4;
      }
      QWidget::setGeometry(this,&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fixToolBarOrientation(QLayoutItem *item, int dockPos)
{
#if QT_CONFIG(toolbar)
    QToolBar *toolBar = qobject_cast<QToolBar*>(item->widget());
    if (toolBar == nullptr)
        return;

    QRect oldGeo = toolBar->geometry();

    QInternal::DockPosition pos
        = static_cast<QInternal::DockPosition>(dockPos);
    Qt::Orientation o = pos == QInternal::TopDock || pos == QInternal::BottomDock
                        ? Qt::Horizontal : Qt::Vertical;
    if (o != toolBar->orientation())
        toolBar->setOrientation(o);

    QSize hint = toolBar->sizeHint().boundedTo(toolBar->maximumSize())
                    .expandedTo(toolBar->minimumSize());

    if (toolBar->size() != hint) {
        QRect newGeo(oldGeo.topLeft(), hint);
        if (toolBar->layoutDirection() == Qt::RightToLeft)
            newGeo.moveRight(oldGeo.right());
        toolBar->setGeometry(newGeo);
    }

#else
    Q_UNUSED(item);
    Q_UNUSED(dockPos);
#endif
}